

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O1

void __thiscall
indk::Neuron::doCreateNewSynapse
          (Neuron *this,string *EName,vector<float,_std::allocator<float>_> *PosVector,float k1,
          int64_t Tl,int NT)

{
  uint _Xm;
  size_t __n;
  Entry *this_00;
  int iVar1;
  Position *this_01;
  Error *this_02;
  pointer ppVar2;
  pointer ppVar3;
  bool bVar4;
  vector<float,_std::allocator<float>_> local_68;
  pointer local_50;
  string *local_48;
  int64_t local_40;
  vector<float,_std::allocator<float>_> *local_38;
  
  local_40 = Tl;
  local_38 = PosVector;
  if ((long)(PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 != (ulong)this->DimensionsCount) {
    this_02 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_02,10);
    __cxa_throw(this_02,&Error::typeinfo,Error::~Error);
  }
  ppVar2 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = ppVar3;
  local_48 = EName;
  if (ppVar2 != ppVar3) {
    do {
      while( true ) {
        __n = (ppVar2->first)._M_string_length;
        if (__n == EName->_M_string_length) {
          if (__n == 0) {
            bVar4 = true;
          }
          else {
            iVar1 = bcmp((ppVar2->first)._M_dataplus._M_p,(EName->_M_dataplus)._M_p,__n);
            bVar4 = iVar1 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if (!bVar4) break;
        this_00 = ppVar2->second;
        this_01 = (Position *)operator_new(0x10);
        _Xm = this->Xm;
        local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (local_38->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (local_38->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (local_38->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        (local_38->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_38->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_38->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Position::Position(this_01,_Xm,&local_68);
        Entry::doAddSynapse(this_00,this_01,this->Xm,k1,local_40,NT);
        EName = local_48;
        if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        ppVar2 = ppVar2 + 1;
        ppVar3 = local_50;
        if (bVar4 || ppVar2 == local_50) {
          return;
        }
      }
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != ppVar3);
  }
  return;
}

Assistant:

void indk::Neuron::doCreateNewSynapse(const std::string& EName, std::vector<float> PosVector, float k1, int64_t Tl, int NT) {
	if (PosVector.size() != DimensionsCount) {
        throw indk::Error(indk::Error::EX_POSITION_DIMENSIONS);
	}
    for (const auto &e: Entries) {
        if (e.first == EName) {
            e.second -> doAddSynapse(new indk::Position(Xm, std::move(PosVector)), Xm, k1, Tl, NT);
            break;
        }
    }
}